

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char * pugi::impl::anon_unknown_0::convert_path_heap(wchar_t *str)

{
  size_t length_00;
  size_t size_00;
  char *result;
  size_t size;
  size_t length;
  wchar_t *str_local;
  
  if (str != (wchar_t *)0x0) {
    length_00 = strlength_wide(str);
    size_00 = as_utf8_begin(str,length_00);
    str_local = (wchar_t *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(size_00 + 1);
    if (str_local == (wchar_t *)0x0) {
      str_local = (wchar_t *)0x0;
    }
    else {
      as_utf8_end((char *)str_local,size_00,str,length_00);
      *(char *)((long)str_local + size_00) = '\0';
    }
    return (char *)str_local;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                ,0x1375,
                "char *pugi::impl::(anonymous namespace)::convert_path_heap(const wchar_t *)");
}

Assistant:

PUGI__FN char* convert_path_heap(const wchar_t* str)
	{
		assert(str);

		// first pass: get length in utf8 characters
		size_t length = strlength_wide(str);
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		char* result = static_cast<char*>(xml_memory::allocate(size + 1));
		if (!result) return 0;

		// second pass: convert to utf8
		as_utf8_end(result, size, str, length);

		// zero-terminate
		result[size] = 0;

		return result;
	}